

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cookmemarena.h
# Opt level: O0

void __thiscall cookmem::FixedArena::FixedArena(FixedArena *this,void *ptr,size_t size)

{
  long lVar1;
  size_t inc;
  size_t remain;
  size_t size_local;
  void *ptr_local;
  FixedArena *this_local;
  
  this->m_used = false;
  if (((ulong)ptr & 0xf) == 0) {
    this->m_page = ptr;
    remain = size;
  }
  else {
    lVar1 = 0x10 - ((ulong)ptr & 0xf);
    this->m_page = (void *)((long)ptr + lVar1);
    remain = size - lVar1;
  }
  this->m_size = remain & 0xfffffffffffffff0;
  return;
}

Assistant:

FixedArena (void* ptr, std::size_t size)
    : m_used (false)
    {
        std::size_t remain = (std::size_t)ptr & 0xfUL;
        if (remain)
        {
            std::size_t inc = (0x10 - remain);
            m_page = (void*)((char*)ptr + inc);
            size -= inc;
        }
        else
        {
            m_page = ptr;
        }
        size &= 0xfffffffffffffff0UL;
        m_size = size;
    }